

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptconfig.c
# Opt level: O3

int poptReadFile(char *fn,char **bp,size_t *nbp,int flags)

{
  int iVar1;
  int iVar2;
  char *__nbytes;
  __off_t _Var3;
  char *__buf;
  char *pcVar4;
  int *piVar5;
  char cVar6;
  char *pcVar7;
  
  __nbytes = (char *)0x0;
  iVar1 = open(fn,0);
  iVar2 = -0x10;
  __buf = (char *)0x0;
  if (iVar1 < 0) goto LAB_001055fa;
  __nbytes = (char *)lseek(iVar1,0,2);
  if (__nbytes == (char *)0xffffffffffffffff) {
LAB_001055cc:
    piVar5 = __errno_location();
    iVar2 = *piVar5;
    close(iVar1);
    *piVar5 = iVar2;
    if (__buf != (char *)0x0) goto LAB_001055e7;
  }
  else {
    __buf = (char *)0x0;
    _Var3 = lseek(iVar1,0,0);
    if (_Var3 == -1) goto LAB_001055cc;
    __buf = (char *)calloc(1,(size_t)(__nbytes + 1));
    if (__buf == (char *)0x0) {
      __buf = (char *)0x0;
      goto LAB_001055cc;
    }
    pcVar4 = (char *)read(iVar1,__buf,(size_t)__nbytes);
    if (pcVar4 != __nbytes) goto LAB_001055cc;
    iVar1 = close(iVar1);
    if (iVar1 != -1) {
      iVar2 = 0;
      if ((flags & 1U) != 0) {
        cVar6 = *__buf;
        pcVar4 = __buf;
        if (0 < (long)__nbytes && cVar6 != '\0') {
          pcVar7 = __buf;
          do {
            if ((cVar6 == '\\') && (pcVar7[1] == '\n')) {
              pcVar7 = pcVar7 + 1;
            }
            else {
              *pcVar4 = cVar6;
              pcVar4 = pcVar4 + 1;
            }
            cVar6 = pcVar7[1];
          } while ((cVar6 != '\0') && (pcVar7 = pcVar7 + 1, pcVar7 < __buf + (long)__nbytes));
        }
        *pcVar4 = '\0';
        __nbytes = pcVar4 + (1 - (long)__buf);
        iVar2 = 0;
      }
      goto LAB_001055fa;
    }
LAB_001055e7:
    free(__buf);
  }
  __nbytes = (char *)0x0;
  __buf = (char *)0x0;
  iVar2 = -0x10;
LAB_001055fa:
  if (bp == (char **)0x0) {
    if (__buf != (char *)0x0) {
      free(__buf);
    }
  }
  else {
    *bp = __buf;
  }
  if (nbp != (size_t *)0x0) {
    *nbp = (size_t)__nbytes;
  }
  return iVar2;
}

Assistant:

int poptReadFile(const char * fn, char ** bp, size_t * nbp, int flags)
{
    int fdno;
    char * b = NULL;
    off_t nb = 0;
    char * s, * t, * se;
    int rc = POPT_ERROR_ERRNO;	/* assume failure */

    fdno = open(fn, O_RDONLY);
    if (fdno < 0)
	goto exit;

    if ((nb = lseek(fdno, 0, SEEK_END)) == (off_t)-1
     || (uintmax_t)nb >= SIZE_MAX
     || lseek(fdno, 0, SEEK_SET) == (off_t)-1
     || (b = calloc(sizeof(*b), (size_t)nb + 1)) == NULL
     || read(fdno, (char *)b, (size_t)nb) != (ssize_t)nb)
    {
	int oerrno = errno;
	(void) close(fdno);
	if (nb != (off_t)-1 && (uintmax_t)nb >= SIZE_MAX)
	    errno = -EOVERFLOW;
	else
	    errno = oerrno;
	goto exit;
    }
    if (close(fdno) == -1)
	goto exit;
    if (b == NULL) {
	rc = POPT_ERROR_MALLOC;
	goto exit;
    }
    rc = 0;

   /* Trim out escaped newlines. */
    if (flags & POPT_READFILE_TRIMNEWLINES)
    {
	for (t = b, s = b, se = b + nb; *s && s < se; s++) {
	    switch (*s) {
	    case '\\':
		if (s[1] == '\n') {
		    s++;
		    continue;
		}
		/* fallthrough */
	    default:
		*t++ = *s;
		break;
	    }
	}
	*t++ = '\0';
	nb = (off_t)(t - b);
    }

exit:
    if (rc != 0) {
	if (b)
	    free(b);
	b = NULL;
	nb = 0;
    }
    if (bp)
	*bp = b;
    else if (b)
	free(b);
    if (nbp)
	*nbp = (size_t)nb;
    return rc;
}